

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O2

int64_t sensors_analytics::utils::GenerateTrackId(void)

{
  int iVar1;
  int64_t __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string timestamp_sub;
  string timestamp;
  string second_sub;
  string second;
  string first_sub;
  string first;
  
  iVar1 = rand();
  std::__cxx11::to_string(&first,iVar1 % 99 + 100);
  std::__cxx11::string::substr((ulong)&first_sub,(ulong)&first);
  iVar1 = rand();
  std::__cxx11::to_string(&second,iVar1 % 999 + 1000);
  std::__cxx11::string::substr((ulong)&second_sub,(ulong)&second);
  __val = CurrentTimestamp();
  std::__cxx11::to_string(&timestamp,__val);
  std::__cxx11::string::substr((ulong)&timestamp_sub,(ulong)&timestamp);
  std::operator+(&bStack_108,&first_sub,&second_sub);
  std::operator+(&local_e8,&bStack_108,&timestamp_sub);
  iVar1 = std::__cxx11::stoi(&local_e8,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&bStack_108);
  std::__cxx11::string::~string((string *)&timestamp_sub);
  std::__cxx11::string::~string((string *)&timestamp);
  std::__cxx11::string::~string((string *)&second_sub);
  std::__cxx11::string::~string((string *)&second);
  std::__cxx11::string::~string((string *)&first_sub);
  std::__cxx11::string::~string((string *)&first);
  return (long)iVar1;
}

Assistant:

int64_t GenerateTrackId() {
    string first = std::to_string(rand() % 99 + 100);
    string first_sub = first.substr(first.length() - 2, 2);

    string second = std::to_string(rand() % 999 + 1000);
    string second_sub = second.substr(second.length() - 3, 3);

    string timestamp = std::to_string(CurrentTimestamp());
    string timestamp_sub = timestamp.substr(timestamp.length() - 4, 4);

    return std::stoi(first_sub + second_sub + timestamp_sub);
}